

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestProperties
               (ostream *stream,TestResult *result)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  char *__s;
  ostream *in_RDI;
  TestProperty *property;
  int i;
  string kProperty;
  string kProperties;
  string *in_stack_fffffffffffffe68;
  ostream *in_stack_fffffffffffffe78;
  int i_00;
  TestResult *in_stack_fffffffffffffe80;
  allocator<char> *in_stack_fffffffffffffea0;
  allocator<char> *__a;
  char *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  undefined1 local_109 [33];
  string local_e8 [39];
  allocator<char> local_c1;
  string local_c0 [32];
  string local_a0 [32];
  TestProperty *local_80;
  int local_74;
  undefined4 local_70;
  allocator<char> local_69;
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [40];
  ostream *local_8;
  
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  std::allocator<char>::~allocator(&local_69);
  iVar1 = TestResult::test_property_count((TestResult *)0x584f7e);
  if (iVar1 < 1) {
    local_70 = 1;
  }
  else {
    poVar3 = std::operator<<(local_8,"<");
    poVar3 = std::operator<<(poVar3,local_30);
    std::operator<<(poVar3,">\n");
    local_74 = 0;
    while( true ) {
      iVar1 = local_74;
      i_00 = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
      iVar2 = TestResult::test_property_count((TestResult *)0x585049);
      if (iVar2 <= iVar1) break;
      local_80 = TestResult::GetTestProperty(in_stack_fffffffffffffe80,i_00);
      poVar3 = std::operator<<(local_8,"<");
      std::operator<<(poVar3,local_68);
      this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::operator<<(local_8," name=\"");
      __s = TestProperty::key((TestProperty *)0x5850d6);
      __a = &local_c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this,__s,__a);
      EscapeXmlAttribute(in_stack_fffffffffffffe68);
      poVar3 = std::operator<<((ostream *)this,local_a0);
      std::operator<<(poVar3,"\"");
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator(&local_c1);
      poVar3 = std::operator<<(local_8," value=\"");
      TestProperty::value((TestProperty *)0x58519a);
      in_stack_fffffffffffffe80 = (TestResult *)local_109;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this,__s,__a);
      EscapeXmlAttribute(in_stack_fffffffffffffe68);
      in_stack_fffffffffffffe78 = std::operator<<(poVar3,local_e8);
      std::operator<<(in_stack_fffffffffffffe78,"\"");
      std::__cxx11::string::~string(local_e8);
      std::__cxx11::string::~string((string *)(local_109 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_109);
      std::operator<<(local_8,"/>\n");
      local_74 = local_74 + 1;
    }
    poVar3 = std::operator<<(local_8,"</");
    poVar3 = std::operator<<(poVar3,local_30);
    std::operator<<(poVar3,">\n");
    local_70 = 0;
  }
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestProperties(
    std::ostream* stream, const TestResult& result) {
  const std::string kProperties = "properties";
  const std::string kProperty = "property";

  if (result.test_property_count() <= 0) {
    return;
  }

  *stream << "<" << kProperties << ">\n";
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    *stream << "<" << kProperty;
    *stream << " name=\"" << EscapeXmlAttribute(property.key()) << "\"";
    *stream << " value=\"" << EscapeXmlAttribute(property.value()) << "\"";
    *stream << "/>\n";
  }
  *stream << "</" << kProperties << ">\n";
}